

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiDockNode::ImGuiDockNode(ImGuiDockNode *this,ImGuiID id)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 10));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x10));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x12));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x14));
  ImGuiWindowClass::ImGuiWindowClass((ImGuiWindowClass *)(in_RDI + 0x17));
  *in_RDI = in_ESI;
  in_RDI[2] = 0;
  in_RDI[1] = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  in_RDI[0x16] = 0xffffffff;
  in_RDI[0x1c] = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x1e) = 0;
  *(undefined8 *)(in_RDI + 0x24) = 0;
  *(undefined8 *)(in_RDI + 0x22) = 0;
  in_RDI[0x28] = 0xffffffff;
  in_RDI[0x27] = 0xffffffff;
  in_RDI[0x26] = 0xffffffff;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0xffc7 | 8;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0xfff8 | 1;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0xfe3f;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0xfdff | 0x200;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0xdfff;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0xefff;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0xf7ff;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0xfbff;
  *(byte *)((long)in_RDI + 0xb2) = *(byte *)((long)in_RDI + 0xb2) & 0xfb;
  *(byte *)((long)in_RDI + 0xb2) = *(byte *)((long)in_RDI + 0xb2) & 0xfd;
  *(byte *)((long)in_RDI + 0xb2) = *(byte *)((long)in_RDI + 0xb2) & 0xfe;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0x7fff;
  *(ushort *)(in_RDI + 0x2c) = *(ushort *)(in_RDI + 0x2c) & 0xbfff;
  *(byte *)((long)in_RDI + 0xb2) = *(byte *)((long)in_RDI + 0xb2) & 0xf7;
  return;
}

Assistant:

ImGuiDockNode::ImGuiDockNode(ImGuiID id)
{
    ID = id;
    SharedFlags = LocalFlags = ImGuiDockNodeFlags_None;
    ParentNode = ChildNodes[0] = ChildNodes[1] = NULL;
    TabBar = NULL;
    SplitAxis = ImGuiAxis_None;

    State = ImGuiDockNodeState_Unknown;
    HostWindow = VisibleWindow = NULL;
    CentralNode = OnlyNodeWithWindows = NULL;
    LastFrameAlive = LastFrameActive = LastFrameFocused = -1;
    LastFocusedNodeID = 0;
    SelectedTabID = 0;
    WantCloseTabID = 0;
    AuthorityForPos = AuthorityForSize = ImGuiDataAuthority_DockNode;
    AuthorityForViewport = ImGuiDataAuthority_Auto;
    IsVisible = true;
    IsFocused = HasCloseButton = HasWindowMenuButton = EnableCloseButton = false;
    WantCloseAll = WantLockSizeOnce = WantMouseMove = WantHiddenTabBarUpdate = WantHiddenTabBarToggle = false;
    MarkedForPosSizeWrite = false;
}